

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_distances.cc
# Opt level: O3

bool S2::AlwaysUpdateMinDistance<true>(S2Point *x,S2Point *a,S2Point *b,S1ChordAngle *min_dist)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  S2LogMessage local_30;
  
  bVar1 = IsUnitLength(x);
  if (bVar1) {
    bVar1 = IsUnitLength(a);
    if (bVar1) {
      bVar1 = IsUnitLength(b);
      if (bVar1) {
        dVar4 = x->c_[1] - a->c_[1];
        dVar2 = x->c_[0] - a->c_[0];
        dVar3 = x->c_[2] - a->c_[2];
        dVar3 = dVar3 * dVar3 + dVar4 * dVar4 + dVar2 * dVar2;
        dVar5 = x->c_[1] - b->c_[1];
        dVar2 = x->c_[0] - b->c_[0];
        dVar4 = x->c_[2] - b->c_[2];
        dVar2 = dVar4 * dVar4 + dVar5 * dVar5 + dVar2 * dVar2;
        bVar1 = AlwaysUpdateMinInteriorDistance<true>(x,a,b,dVar3,dVar2,min_dist);
        if (!bVar1) {
          if (dVar3 <= dVar2) {
            dVar2 = dVar3;
          }
          if (4.0 <= dVar2) {
            dVar2 = 4.0;
          }
          S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_30,dVar2);
          min_dist->length2_ = (double)local_30._0_8_;
        }
        return true;
      }
    }
  }
  S2LogMessage::S2LogMessage
            (&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_distances.cc"
             ,0xa7,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_30.stream_,
             "Check failed: S2::IsUnitLength(x) && S2::IsUnitLength(a) && S2::IsUnitLength(b) ",0x50
            );
  abort();
}

Assistant:

inline bool AlwaysUpdateMinDistance(const S2Point& x,
                                    const S2Point& a, const S2Point& b,
                                    S1ChordAngle* min_dist) {
  S2_DCHECK(S2::IsUnitLength(x) && S2::IsUnitLength(a) && S2::IsUnitLength(b));

  double xa2 = (x-a).Norm2(), xb2 = (x-b).Norm2();
  if (AlwaysUpdateMinInteriorDistance<always_update>(x, a, b, xa2, xb2,
                                                     min_dist)) {
    return true;  // Minimum distance is attained along the edge interior.
  }
  // Otherwise the minimum distance is to one of the endpoints.
  double dist2 = min(xa2, xb2);
  if (!always_update && dist2 >= min_dist->length2()) {
    return false;
  }
  *min_dist = S1ChordAngle::FromLength2(dist2);
  return true;
}